

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O3

void __thiscall cmCTestMultiProcessHandler::PrintLabels(cmCTestMultiProcessHandler *this)

{
  _Rb_tree_header *__position;
  _Base_ptr p_Var1;
  cmCTest *pcVar2;
  _Base_ptr p_Var3;
  ostream *poVar4;
  _Base_ptr __v;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  allLabels;
  ostringstream cmCTestLog_msg;
  long *local_208;
  long local_1f8 [2];
  cmCTestMultiProcessHandler *local_1e8;
  _Rb_tree_node_base *local_1e0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d8;
  undefined1 local_1a8 [376];
  
  __position = &local_1d8._M_impl.super__Rb_tree_header;
  local_1d8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1d8._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var3 = (this->Properties).
           super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
           ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_1e0 = &(this->Properties).
               super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
               ._M_t._M_impl.super__Rb_tree_header._M_header;
  local_1d8._M_impl.super__Rb_tree_header._M_header._M_left = &__position->_M_header;
  local_1d8._M_impl.super__Rb_tree_header._M_header._M_right = &__position->_M_header;
  if (p_Var3 != local_1e0) {
    local_1e8 = this;
    do {
      p_Var1 = p_Var3[1]._M_parent[0xc]._M_parent;
      local_1a8._0_8_ =
           (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            *)&local_1d8;
      for (__v = *(_Base_ptr *)(p_Var3[1]._M_parent + 0xc); __v != p_Var1; __v = __v + 1) {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::
        _M_insert_unique_<std::__cxx11::string&,std::_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::_Alloc_node>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&local_1d8,(const_iterator)__position,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__v,
                   (_Alloc_node *)local_1a8);
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
      this = local_1e8;
    } while (p_Var3 != local_1e0);
    if (local_1d8._M_impl.super__Rb_tree_header._M_node_count != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"All Labels:",0xb);
      std::ios::widen((char)(ostream *)local_1a8 +
                      (char)*(undefined8 *)
                             ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                               *)(local_1a8._0_8_ + -0x30) + 0x18));
      std::ostream::put((char)local_1a8);
      std::ostream::flush();
      pcVar2 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar2,2,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                   ,0x2ec,(char *)local_208,this->Quiet);
      goto LAB_0031f569;
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"No Labels Exist",0xf);
  std::ios::widen((char)(ostream *)local_1a8 +
                  (char)*(undefined8 *)
                         ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                           *)(local_1a8._0_8_ + -0x30) + 0x18));
  std::ostream::put((char)local_1a8);
  std::ostream::flush();
  pcVar2 = this->CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar2,2,
               "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
               ,0x2ef,(char *)local_208,this->Quiet);
LAB_0031f569:
  if (local_208 != local_1f8) {
    operator_delete(local_208,local_1f8[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  if ((_Rb_tree_header *)local_1d8._M_impl.super__Rb_tree_header._M_header._M_left != __position) {
    p_Var3 = local_1d8._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  ",2);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,*(char **)(p_Var3 + 1),(long)p_Var3[1]._M_parent);
      std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      pcVar2 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar2,2,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                   ,0x2f4,(char *)local_208,this->Quiet);
      if (local_208 != local_1f8) {
        operator_delete(local_208,local_1f8[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != __position);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_1d8);
  return;
}

Assistant:

void cmCTestMultiProcessHandler::PrintLabels()
{
  std::set<std::string> allLabels;
  for (PropertiesMap::iterator it = this->Properties.begin();
       it != this->Properties.end(); ++it) {
    cmCTestTestHandler::cmCTestTestProperties& p = *it->second;
    allLabels.insert(p.Labels.begin(), p.Labels.end());
  }

  if (!allLabels.empty()) {
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, "All Labels:" << std::endl,
                       this->Quiet);
  } else {
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                       "No Labels Exist" << std::endl, this->Quiet);
  }
  for (std::set<std::string>::iterator label = allLabels.begin();
       label != allLabels.end(); ++label) {
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                       "  " << *label << std::endl, this->Quiet);
  }
}